

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

void u_charsToUChars_63(char *cs,UChar *us,int32_t length)

{
  int local_1c;
  uint8_t c;
  UChar u;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *us_local;
  char *cs_local;
  
  pUStack_18 = us;
  us_local = (UChar *)cs;
  for (local_1c = length; 0 < local_1c; local_1c = local_1c + -1) {
    *pUStack_18 = (ushort)(byte)*us_local;
    pUStack_18 = pUStack_18 + 1;
    us_local = (UChar *)((long)us_local + 1);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_charsToUChars(const char *cs, UChar *us, int32_t length) {
    UChar u;
    uint8_t c;

    /*
     * Allow the entire ASCII repertoire to be mapped _to_ Unicode.
     * For EBCDIC systems, this works for characters with codes from
     * codepages 37 and 1047 or compatible.
     */
    while(length>0) {
        c=(uint8_t)(*cs++);
        u=(UChar)CHAR_TO_UCHAR(c);
        U_ASSERT((u!=0 || c==0)); /* only invariant chars converted? */
        *us++=u;
        --length;
    }
}